

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signals.cpp
# Opt level: O0

bool printSymbolizedStackTrace(StringRef Argv0,void **StackTrace,int Depth,raw_ostream *OS)

{
  Optional<llvm::ArrayRef<llvm::StringRef>_> Env;
  StringRef Str;
  StringRef Str_00;
  undefined1 auVar1 [8];
  bool bVar2;
  size_t sVar3;
  char **Modules_00;
  long *Offsets_00;
  char *pcVar4;
  reference ppcVar5;
  raw_ostream *prVar6;
  reference pvVar7;
  undefined8 uVar8;
  reference this;
  pointer this_00;
  uint64_t *puVar9;
  StringRef *MainAddr;
  undefined8 *puVar10;
  size_type in_R9;
  pointer *ResultPath;
  StringRef path;
  error_code eVar11;
  StringRef Name;
  StringRef Name_00;
  StringRef Suffix;
  ArrayRef<llvm::StringRef> Paths;
  ArrayRef<llvm::StringRef> Paths_00;
  FormattedNumber local_a40;
  char *local_a28;
  char *local_a20;
  char *local_a18;
  char *local_a08;
  StringRef FileLineInfo;
  FormattedNumber local_9d8;
  char *local_9c0;
  StringRef FunctionName;
  int local_998;
  int local_994;
  int i_1;
  int frame_no;
  iterator CurLine;
  undefined1 local_978 [8];
  SmallVector<llvm::StringRef,_32U> Lines;
  StringRef Output;
  undefined1 local_740 [8];
  ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_> OutputBuf;
  Optional<llvm::ArrayRef<llvm::StringRef>_> local_718;
  ArrayRef<llvm::StringRef> local_700;
  StringRef local_6f0;
  int local_6dc;
  undefined1 auStack_6d8 [4];
  int RunResult;
  StringRef Args [4];
  StringRef local_688;
  undefined1 local_678 [8];
  Optional<llvm::StringRef> Redirects [3];
  undefined1 local_628 [4];
  int i;
  raw_fd_ostream Input;
  undefined1 local_5c0 [8];
  FileRemover OutputRemover;
  undefined1 local_510 [8];
  FileRemover InputRemover;
  StringRef local_468;
  Twine local_458;
  int local_440;
  error_category *local_438;
  Twine *local_430;
  Twine local_420;
  undefined1 local_408 [8];
  SmallString<32U> OutputFile;
  SmallString<32U> InputFile;
  int InputFD;
  undefined1 local_398 [8];
  vector<long,_std::allocator<long>_> Offsets;
  value_type local_378;
  undefined1 local_370 [8];
  vector<const_char_*,_std::allocator<const_char_*>_> Modules;
  StringSaver StrPool;
  BumpPtrAllocator Allocator;
  string MainExecutableName;
  string *LLVMSymbolizerPath;
  ArrayRef<llvm::StringRef> local_2b8;
  sys *local_2a8;
  char *local_2a0;
  ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_298;
  ArrayRef<llvm::StringRef> local_270;
  sys *local_260;
  char *local_258;
  ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_250;
  void **local_228;
  char *local_220;
  undefined1 local_218 [8];
  StringRef Parent;
  error_category *local_200;
  undefined1 local_1f8 [8];
  ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  LLVMSymbolizerPathOrErr;
  raw_ostream *OS_local;
  int Depth_local;
  void **StackTrace_local;
  StringRef Argv0_local;
  int local_2c;
  int local_c;
  
  Argv0_local.Data = (char *)Argv0.Length;
  StackTrace_local = (void **)Argv0.Data;
  if (DisableSymbolicationFlag) {
    Argv0_local.Length._7_1_ = 0;
  }
  else {
    strlen("llvm-symbolizer");
    MainAddr = (StringRef *)0x0;
    sVar3 = llvm::StringRef::find((StringRef *)&StackTrace_local,stack0xfffffffffffffe30,0);
    if (sVar3 == 0xffffffffffffffff) {
      std::error_code::error_code((error_code *)&Parent.Length);
      eVar11._4_4_ = 0;
      eVar11._M_value = (uint)Parent.Length;
      eVar11._M_cat = local_200;
      llvm::
      ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ErrorOr((ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_1f8,eVar11);
      if (Argv0_local.Data != (char *)0x0) {
        local_228 = StackTrace_local;
        local_220 = Argv0_local.Data;
        path.Length = 2;
        path.Data = Argv0_local.Data;
        _local_218 = llvm::sys::path::parent_path((path *)StackTrace_local,path,(Style)MainAddr);
        if (Parent.Data != (char *)0x0) {
          local_260 = (sys *)0x2799e0;
          local_258 = (char *)strlen("llvm-symbolizer");
          llvm::ArrayRef<llvm::StringRef>::ArrayRef(&local_270,(StringRef *)local_218);
          Name.Length = (size_t)local_270.Data;
          Name.Data = local_258;
          Paths.Length = in_R9;
          Paths.Data = (StringRef *)local_270.Length;
          llvm::sys::findProgramByName_abi_cxx11_(&local_250,local_260,Name,Paths);
          llvm::
          ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator=((ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_1f8,&local_250);
          llvm::
          ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~ErrorOr(&local_250);
          MainAddr = local_270.Data;
        }
      }
      bVar2 = llvm::ErrorOr::operator_cast_to_bool((ErrorOr *)local_1f8);
      if (!bVar2) {
        local_2a8 = (sys *)0x2799e0;
        local_2a0 = (char *)strlen("llvm-symbolizer");
        memset(&local_2b8,0,0x10);
        llvm::ArrayRef<llvm::StringRef>::ArrayRef(&local_2b8);
        Name_00.Length = (size_t)local_2b8.Data;
        Name_00.Data = local_2a0;
        Paths_00.Length = in_R9;
        Paths_00.Data = (StringRef *)local_2b8.Length;
        llvm::sys::findProgramByName_abi_cxx11_(&local_298,local_2a8,Name_00,Paths_00);
        llvm::
        ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        operator=((ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_1f8,&local_298);
        llvm::
        ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        ~ErrorOr(&local_298);
        MainAddr = local_2b8.Data;
      }
      bVar2 = llvm::ErrorOr::operator_cast_to_bool((ErrorOr *)local_1f8);
      if (bVar2) {
        llvm::
        ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        operator*((ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_1f8);
        if (Argv0_local.Data == (char *)0x0) {
          llvm::sys::fs::getMainExecutable_abi_cxx11_
                    ((string *)&Allocator.field_0x60,(fs *)0x0,(char *)0x0,MainAddr);
        }
        else {
          llvm::StringRef::operator_cast_to_string
                    ((string *)&Allocator.field_0x60,(StringRef *)&StackTrace_local);
        }
        llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::BumpPtrAllocatorImpl
                  ((BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL> *)&StrPool);
        llvm::StringSaver::StringSaver
                  ((StringSaver *)
                   &Modules.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,(BumpPtrAllocator *)&StrPool);
        local_378 = (value_type)0x0;
        std::allocator<const_char_*>::allocator
                  ((allocator<const_char_*> *)
                   ((long)&Offsets.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 7));
        std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
                  ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_370,(long)Depth,
                   &local_378,
                   (allocator_type *)
                   ((long)&Offsets.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 7));
        std::allocator<const_char_*>::~allocator
                  ((allocator<const_char_*> *)
                   ((long)&Offsets.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 7));
        _InputFD = 0;
        std::allocator<long>::allocator
                  ((allocator<long> *)
                   (InputFile.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.
                    InlineElts + 0x1f));
        std::vector<long,_std::allocator<long>_>::vector
                  ((vector<long,_std::allocator<long>_> *)local_398,(long)Depth,
                   (value_type_conflict6 *)&InputFD,
                   (allocator_type *)
                   (InputFile.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.
                    InlineElts + 0x1f));
        std::allocator<long>::~allocator
                  ((allocator<long> *)
                   (InputFile.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.
                    InlineElts + 0x1f));
        Modules_00 = std::vector<const_char_*,_std::allocator<const_char_*>_>::data
                               ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_370);
        Offsets_00 = std::vector<long,_std::allocator<long>_>::data
                               ((vector<long,_std::allocator<long>_> *)local_398);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        ResultPath = &Modules.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage;
        bVar2 = findModulesAndOffsets
                          (StackTrace,Depth,Modules_00,Offsets_00,pcVar4,(StringSaver *)ResultPath);
        if (bVar2) {
          llvm::SmallString<32U>::SmallString
                    ((SmallString<32U> *)
                     (OutputFile.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.
                      InlineElts + 0x18));
          llvm::SmallString<32U>::SmallString((SmallString<32U> *)local_408);
          llvm::Twine::Twine(&local_420,"symbolizer-input");
          local_430 = (Twine *)0x26ff77;
          pcVar4 = (char *)strlen("");
          Suffix.Length =
               (size_t)(InputFile.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.
                        InlineElts + 0x18);
          Suffix.Data = pcVar4;
          eVar11 = llvm::sys::fs::createTemporaryFile
                             ((fs *)&local_420,local_430,Suffix,
                              (int *)(OutputFile.super_SmallVector<char,_32U>.
                                      super_SmallVectorStorage<char,_32U>.InlineElts + 0x18),
                              (SmallVectorImpl<char> *)ResultPath);
          local_438 = eVar11._M_cat;
          local_440 = eVar11._M_value;
          llvm::Twine::Twine(&local_458,"symbolizer-output");
          strlen("");
          eVar11 = llvm::sys::fs::createTemporaryFile
                             (&local_458,local_468,(SmallVectorImpl<char> *)local_408);
          InputRemover._144_4_ = eVar11._M_value;
          pcVar4 = llvm::SmallString<32U>::c_str
                             ((SmallString<32U> *)
                              (OutputFile.super_SmallVector<char,_32U>.
                               super_SmallVectorStorage<char,_32U>.InlineElts + 0x18));
          llvm::Twine::Twine((Twine *)&OutputRemover.DeleteIt,pcVar4);
          llvm::FileRemover::FileRemover
                    ((FileRemover *)local_510,(Twine *)&OutputRemover.DeleteIt,true);
          pcVar4 = llvm::SmallString<32U>::c_str((SmallString<32U> *)local_408);
          llvm::Twine::Twine((Twine *)&Input.SupportsSeeking,pcVar4);
          llvm::FileRemover::FileRemover
                    ((FileRemover *)local_5c0,(Twine *)&Input.SupportsSeeking,true);
          llvm::raw_fd_ostream::raw_fd_ostream
                    ((raw_fd_ostream *)local_628,
                     InputFile.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.
                     InlineElts._24_4_,true,false);
          for (Redirects[2].Storage._20_4_ = 0; (int)Redirects[2].Storage._20_4_ < Depth;
              Redirects[2].Storage._20_4_ = Redirects[2].Storage._20_4_ + 1) {
            ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                                ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_370,
                                 (long)(int)Redirects[2].Storage._20_4_);
            if (*ppcVar5 != (value_type)0x0) {
              ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                                  ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_370,
                                   (long)(int)Redirects[2].Storage._20_4_);
              prVar6 = llvm::raw_ostream::operator<<((raw_ostream *)local_628,*ppcVar5);
              prVar6 = llvm::raw_ostream::operator<<(prVar6," ");
              pvVar7 = std::vector<long,_std::allocator<long>_>::operator[]
                                 ((vector<long,_std::allocator<long>_> *)local_398,
                                  (long)(int)Redirects[2].Storage._20_4_);
              prVar6 = llvm::raw_ostream::operator<<(prVar6,(void *)*pvVar7);
              llvm::raw_ostream::operator<<(prVar6,"\n");
            }
          }
          llvm::raw_fd_ostream::~raw_fd_ostream((raw_fd_ostream *)local_628);
          local_688 = llvm::SmallString::operator_cast_to_StringRef
                                ((SmallString *)
                                 (OutputFile.super_SmallVector<char,_32U>.
                                  super_SmallVectorStorage<char,_32U>.InlineElts + 0x18));
          llvm::Optional<llvm::StringRef>::Optional
                    ((Optional<llvm::StringRef> *)local_678,&local_688);
          join_0x00000010_0x00000000_ =
               llvm::SmallString::operator_cast_to_StringRef((SmallString *)local_408);
          llvm::Optional<llvm::StringRef>::Optional
                    ((Optional<llvm::StringRef> *)&Redirects[0].Storage.hasVal,
                     (StringRef *)&Args[3].Length);
          llvm::Optional<llvm::StringRef>::Optional
                    ((Optional<llvm::StringRef> *)&Redirects[1].Storage.hasVal,None);
          _auStack_6d8 = "llvm-symbolizer";
          Args[0].Data = (char *)strlen("llvm-symbolizer");
          Args[0].Length = (size_t)anon_var_dwarf_136e98;
          Args[1].Data = (char *)strlen("--functions=linkage");
          Args[1].Length = (size_t)anon_var_dwarf_136eae;
          Args[2].Data = (char *)strlen("--inlining");
          Args[2].Length = (size_t)anon_var_dwarf_136ec4;
          Args[3].Data = (char *)strlen("--demangle");
          uVar8 = std::__cxx11::string::data();
          local_6f0.Data = (char *)uVar8;
          uVar8 = std::__cxx11::string::length();
          local_6f0.Length = uVar8;
          llvm::ArrayRef<llvm::StringRef>::ArrayRef<4ul>(&local_700,(StringRef (*) [4])auStack_6d8);
          llvm::Optional<llvm::ArrayRef<llvm::StringRef>_>::Optional(&local_718,None);
          llvm::ArrayRef<llvm::Optional<llvm::StringRef>>::ArrayRef<3ul>
                    ((ArrayRef<llvm::Optional<llvm::StringRef>> *)&OutputBuf.field_0x10,
                     (Optional<llvm::StringRef> (*) [3])local_678);
          Env.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[8] =
               local_718.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[8];
          Env.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[9] =
               local_718.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[9];
          Env.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[10] =
               local_718.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[10];
          Env.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[0xb] =
               local_718.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[0xb];
          Env.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[0xc] =
               local_718.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[0xc];
          Env.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[0xd] =
               local_718.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[0xd];
          Env.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[0xe] =
               local_718.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[0xe];
          Env.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[0xf] =
               local_718.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[0xf];
          Env.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[0] =
               local_718.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[0];
          Env.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[1] =
               local_718.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[1];
          Env.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[2] =
               local_718.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[2];
          Env.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[3] =
               local_718.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[3];
          Env.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[4] =
               local_718.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[4];
          Env.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[5] =
               local_718.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[5];
          Env.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[6] =
               local_718.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[6];
          Env.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[7] =
               local_718.Storage.storage.super_AlignedCharArray<8UL,_16UL>.buffer[7];
          Env.Storage.hasVal = local_718.Storage.hasVal;
          Env.Storage._17_7_ = local_718.Storage._17_7_;
          local_6dc = llvm::sys::ExecuteAndWait
                                (local_6f0,local_700,Env,stack0xfffffffffffff8d8,0,0,(string *)0x0,
                                 (bool *)0x0);
          if (local_6dc == 0) {
            pcVar4 = llvm::SmallString<32U>::c_str((SmallString<32U> *)local_408);
            llvm::Twine::Twine((Twine *)&Output.Length,pcVar4);
            llvm::MemoryBuffer::getFile
                      ((ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
                        *)local_740,(Twine *)&Output.Length,-1,true,false);
            bVar2 = llvm::ErrorOr::operator_cast_to_bool((ErrorOr *)local_740);
            if (bVar2) {
              this = llvm::
                     ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
                     ::get((ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
                            *)local_740);
              this_00 = std::
                        unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::
                        operator->(this);
              join_0x00000010_0x00000000_ = llvm::MemoryBuffer::getBuffer(this_00);
              llvm::SmallVector<llvm::StringRef,_32U>::SmallVector
                        ((SmallVector<llvm::StringRef,_32U> *)local_978);
              strlen("\n");
              llvm::StringRef::split
                        ((StringRef *)
                         (Lines.super_SmallVectorStorage<llvm::StringRef,_32U>.InlineElts[0x1f].
                          super_AlignedCharArray<8UL,_16UL>.buffer + 8),
                         (SmallVectorImpl<llvm::StringRef> *)local_978,_CurLine,-1,true);
              _i_1 = (undefined8 *)local_978;
              local_994 = 0;
              for (local_998 = 0; local_998 < Depth; local_998 = local_998 + 1) {
                ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                                    ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                                     local_370,(long)local_998);
                if (*ppcVar5 == (value_type)0x0) {
                  prVar6 = llvm::raw_ostream::operator<<(OS,'#');
                  prVar6 = llvm::raw_ostream::operator<<(prVar6,local_994);
                  prVar6 = llvm::raw_ostream::operator<<(prVar6,' ');
                  format_ptr((FormattedNumber *)&FunctionName.Length,StackTrace[local_998]);
                  prVar6 = llvm::raw_ostream::operator<<
                                     (prVar6,(FormattedNumber *)&FunctionName.Length);
                  llvm::raw_ostream::operator<<(prVar6,'\n');
                  local_994 = local_994 + 1;
                  puVar10 = _i_1;
                }
                else {
                  while( true ) {
                    auVar1 = local_978;
                    sVar3 = llvm::SmallVectorBase::size((SmallVectorBase *)local_978);
                    if (_i_1 == (undefined8 *)((long)auVar1 + sVar3 * 2 * 8)) {
                      Argv0_local.Length._7_1_ = 0;
                      goto LAB_001cf8f1;
                    }
                    puVar10 = _i_1 + 2;
                    local_9c0 = (char *)*_i_1;
                    FunctionName.Data = (char *)_i_1[1];
                    if (FunctionName.Data == (char *)0x0) break;
                    prVar6 = llvm::raw_ostream::operator<<(OS,'#');
                    prVar6 = llvm::raw_ostream::operator<<(prVar6,local_994);
                    prVar6 = llvm::raw_ostream::operator<<(prVar6,' ');
                    format_ptr(&local_9d8,StackTrace[local_998]);
                    prVar6 = llvm::raw_ostream::operator<<(prVar6,&local_9d8);
                    llvm::raw_ostream::operator<<(prVar6,' ');
                    pcVar4 = (char *)strlen("??");
                    bVar2 = false;
                    if (pcVar4 <= FunctionName.Data) {
                      if (pcVar4 == (char *)0x0) {
                        local_2c = 0;
                      }
                      else {
                        local_2c = memcmp(local_9c0,"??",(size_t)pcVar4);
                      }
                      bVar2 = local_2c == 0;
                    }
                    if (!bVar2) {
                      FileLineInfo.Length = (size_t)local_9c0;
                      Str_00.Length = (size_t)FunctionName.Data;
                      Str_00.Data = local_9c0;
                      prVar6 = llvm::raw_ostream::operator<<(OS,Str_00);
                      llvm::raw_ostream::operator<<(prVar6,' ');
                    }
                    auVar1 = local_978;
                    sVar3 = llvm::SmallVectorBase::size((SmallVectorBase *)local_978);
                    if (puVar10 == (undefined8 *)((long)auVar1 + sVar3 * 2 * 8)) {
                      Argv0_local.Length._7_1_ = 0;
                      goto LAB_001cf8f1;
                    }
                    local_a08 = (char *)*puVar10;
                    FileLineInfo.Data = (char *)_i_1[3];
                    local_a18 = "??";
                    pcVar4 = (char *)strlen("??");
                    bVar2 = false;
                    if (pcVar4 <= FileLineInfo.Data) {
                      if (pcVar4 == (char *)0x0) {
                        local_c = 0;
                      }
                      else {
                        local_c = memcmp(local_a08,local_a18,(size_t)pcVar4);
                      }
                      bVar2 = local_c == 0;
                    }
                    if (bVar2) {
                      prVar6 = llvm::raw_ostream::operator<<(OS,"(");
                      ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                                          ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                                           local_370,(long)local_998);
                      prVar6 = llvm::raw_ostream::operator<<(prVar6,*ppcVar5);
                      prVar6 = llvm::raw_ostream::operator<<(prVar6,'+');
                      puVar9 = (uint64_t *)
                               std::vector<long,_std::allocator<long>_>::operator[]
                                         ((vector<long,_std::allocator<long>_> *)local_398,
                                          (long)local_998);
                      llvm::format_hex(&local_a40,*puVar9,0,false);
                      prVar6 = llvm::raw_ostream::operator<<(prVar6,&local_a40);
                      llvm::raw_ostream::operator<<(prVar6,")");
                    }
                    else {
                      local_a28 = local_a08;
                      local_a20 = FileLineInfo.Data;
                      Str.Length = (size_t)FileLineInfo.Data;
                      Str.Data = local_a08;
                      llvm::raw_ostream::operator<<(OS,Str);
                    }
                    llvm::raw_ostream::operator<<(OS,"\n");
                    local_994 = local_994 + 1;
                    _i_1 = _i_1 + 4;
                  }
                }
                _i_1 = puVar10;
              }
              Argv0_local.Length._7_1_ = 1;
LAB_001cf8f1:
              llvm::SmallVector<llvm::StringRef,_32U>::~SmallVector
                        ((SmallVector<llvm::StringRef,_32U> *)local_978);
            }
            else {
              Argv0_local.Length._7_1_ = 0;
            }
            llvm::
            ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
            ::~ErrorOr((ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
                        *)local_740);
          }
          else {
            Argv0_local.Length._7_1_ = 0;
          }
          llvm::FileRemover::~FileRemover((FileRemover *)local_5c0);
          llvm::FileRemover::~FileRemover((FileRemover *)local_510);
          llvm::SmallString<32U>::~SmallString((SmallString<32U> *)local_408);
          llvm::SmallString<32U>::~SmallString
                    ((SmallString<32U> *)
                     (OutputFile.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.
                      InlineElts + 0x18));
        }
        else {
          Argv0_local.Length._7_1_ = 0;
        }
        std::vector<long,_std::allocator<long>_>::~vector
                  ((vector<long,_std::allocator<long>_> *)local_398);
        std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
                  ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_370);
        llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::~BumpPtrAllocatorImpl
                  ((BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL> *)&StrPool);
        std::__cxx11::string::~string((string *)&Allocator.field_0x60);
      }
      else {
        Argv0_local.Length._7_1_ = 0;
      }
      llvm::
      ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~ErrorOr((ErrorOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1f8);
    }
    else {
      Argv0_local.Length._7_1_ = 0;
    }
  }
  return (bool)(Argv0_local.Length._7_1_ & 1);
}

Assistant:

LLVM_ATTRIBUTE_USED
static bool printSymbolizedStackTrace(StringRef Argv0, void **StackTrace,
                                      int Depth, llvm::raw_ostream &OS) {
  if (DisableSymbolicationFlag)
    return false;

  // Don't recursively invoke the llvm-symbolizer binary.
  if (Argv0.find("llvm-symbolizer") != std::string::npos)
    return false;

  // FIXME: Subtract necessary number from StackTrace entries to turn return addresses
  // into actual instruction addresses.
  // Use llvm-symbolizer tool to symbolize the stack traces. First look for it
  // alongside our binary, then in $PATH.
  ErrorOr<std::string> LLVMSymbolizerPathOrErr = std::error_code();
  if (!Argv0.empty()) {
    StringRef Parent = llvm::sys::path::parent_path(Argv0);
    if (!Parent.empty())
      LLVMSymbolizerPathOrErr = sys::findProgramByName("llvm-symbolizer", Parent);
  }
  if (!LLVMSymbolizerPathOrErr)
    LLVMSymbolizerPathOrErr = sys::findProgramByName("llvm-symbolizer");
  if (!LLVMSymbolizerPathOrErr)
    return false;
  const std::string &LLVMSymbolizerPath = *LLVMSymbolizerPathOrErr;

  // If we don't know argv0 or the address of main() at this point, try
  // to guess it anyway (it's possible on some platforms).
  std::string MainExecutableName =
      Argv0.empty() ? sys::fs::getMainExecutable(nullptr, nullptr)
                    : (std::string)Argv0;
  BumpPtrAllocator Allocator;
  StringSaver StrPool(Allocator);
  std::vector<const char *> Modules(Depth, nullptr);
  std::vector<intptr_t> Offsets(Depth, 0);
  if (!findModulesAndOffsets(StackTrace, Depth, Modules.data(), Offsets.data(),
                             MainExecutableName.c_str(), StrPool))
    return false;
  int InputFD;
  SmallString<32> InputFile, OutputFile;
  sys::fs::createTemporaryFile("symbolizer-input", "", InputFD, InputFile);
  sys::fs::createTemporaryFile("symbolizer-output", "", OutputFile);
  FileRemover InputRemover(InputFile.c_str());
  FileRemover OutputRemover(OutputFile.c_str());

  {
    raw_fd_ostream Input(InputFD, true);
    for (int i = 0; i < Depth; i++) {
      if (Modules[i])
        Input << Modules[i] << " " << (void*)Offsets[i] << "\n";
    }
  }

  Optional<StringRef> Redirects[] = {StringRef(InputFile),
                                     StringRef(OutputFile), llvm::None};
  StringRef Args[] = {"llvm-symbolizer", "--functions=linkage", "--inlining",
#ifdef _WIN32
                      // Pass --relative-address on Windows so that we don't
                      // have to add ImageBase from PE file.
                      // FIXME: Make this the default for llvm-symbolizer.
                      "--relative-address",
#endif
                      "--demangle"};
  int RunResult =
      sys::ExecuteAndWait(LLVMSymbolizerPath, Args, None, Redirects);
  if (RunResult != 0)
    return false;

  // This report format is based on the sanitizer stack trace printer.  See
  // sanitizer_stacktrace_printer.cc in compiler-rt.
  auto OutputBuf = MemoryBuffer::getFile(OutputFile.c_str());
  if (!OutputBuf)
    return false;
  StringRef Output = OutputBuf.get()->getBuffer();
  SmallVector<StringRef, 32> Lines;
  Output.split(Lines, "\n");
  auto CurLine = Lines.begin();
  int frame_no = 0;
  for (int i = 0; i < Depth; i++) {
    if (!Modules[i]) {
      OS << '#' << frame_no++ << ' ' << format_ptr(StackTrace[i]) << '\n';
      continue;
    }
    // Read pairs of lines (function name and file/line info) until we
    // encounter empty line.
    for (;;) {
      if (CurLine == Lines.end())
        return false;
      StringRef FunctionName = *CurLine++;
      if (FunctionName.empty())
        break;
      OS << '#' << frame_no++ << ' ' << format_ptr(StackTrace[i]) << ' ';
      if (!FunctionName.startswith("??"))
        OS << FunctionName << ' ';
      if (CurLine == Lines.end())
        return false;
      StringRef FileLineInfo = *CurLine++;
      if (!FileLineInfo.startswith("??"))
        OS << FileLineInfo;
      else
        OS << "(" << Modules[i] << '+' << format_hex(Offsets[i], 0) << ")";
      OS << "\n";
    }
  }
  return true;
}